

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O0

BOOL VirtualFree(LPVOID lpAddress,SIZE_T dwSize,DWORD dwFreeType)

{
  int iVar1;
  BOOL BVar2;
  CPalThread *pThread;
  ulong uVar3;
  void *__addr;
  PCMI p_Var4;
  undefined1 *puVar5;
  PCMI pMemoryToBeReleased;
  SIZE_T nNumOfPagesToChange;
  SIZE_T index;
  PCMI pUnCommittedMem;
  SIZE_T MemSize;
  UINT_PTR StartBoundary;
  CPalThread *pthrCurrent;
  BOOL bRetVal;
  DWORD dwFreeType_local;
  SIZE_T dwSize_local;
  LPVOID lpAddress_local;
  
  pthrCurrent._0_4_ = 1;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pThread = CorUnix::InternalGetCurrentThread();
  CorUnix::InternalEnterCriticalSection(pThread,&virtual_critsec);
  if (lpAddress == (LPVOID)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    CorUnix::CPalThread::SetLastError(0x1e7);
    pthrCurrent._0_4_ = 0;
  }
  else if (((dwFreeType & 0x8000) == 0) && ((dwFreeType & 0x4000) == 0)) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    CorUnix::CPalThread::SetLastError(0x57);
    pthrCurrent._0_4_ = 0;
  }
  else if (((dwFreeType & 0x8000) == 0) || ((dwFreeType & 0x4000) == 0)) {
    if ((dwFreeType & 0x4000) == 0) {
      if ((dwFreeType & 0x8000) != 0) {
        p_Var4 = VIRTUALFindRegionInformation((UINT_PTR)lpAddress);
        if (p_Var4 == (PCMI)0x0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          CorUnix::CPalThread::SetLastError(0x1e7);
          pthrCurrent._0_4_ = 0;
        }
        else if (dwSize == 0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          iVar1 = munmap((void *)p_Var4->startBoundary,p_Var4->memSize);
          if (iVar1 == 0) {
            BVar2 = VIRTUALReleaseMemory(p_Var4);
            if (BVar2 == 0) {
              fprintf(_stderr,"] %s %s:%d","VirtualFree",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
                      ,0x88a);
              fprintf(_stderr,"Unable to remove the PCMI entry from the list.\n");
              CorUnix::CPalThread::SetLastError(0x54f);
              pthrCurrent._0_4_ = 0;
            }
          }
          else {
            fprintf(_stderr,"] %s %s:%d","VirtualFree",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
                    ,0x898);
            fprintf(_stderr,"Unable to unmap the memory, munmap() returned an abnormal value.\n");
            CorUnix::CPalThread::SetLastError(0x54f);
            pthrCurrent._0_4_ = 0;
          }
        }
        else {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          CorUnix::CPalThread::SetLastError(0x57);
          pthrCurrent._0_4_ = 0;
        }
      }
    }
    else if (dwSize == 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      CorUnix::CPalThread::SetLastError(0x57);
      pthrCurrent._0_4_ = 0;
    }
    else {
      uVar3 = dwSize + ((ulong)lpAddress & 0xfff) + 0xfff;
      __addr = (void *)((ulong)lpAddress & 0xfffffffffffff000);
      p_Var4 = VIRTUALFindRegionInformation((UINT_PTR)__addr);
      if (p_Var4 == (PCMI)0x0) {
        fprintf(_stderr,"] %s %s:%d","VirtualFree",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
                ,0x826);
        fprintf(_stderr,"Unable to locate the region information.\n");
        CorUnix::CPalThread::SetLastError(0x54f);
        pthrCurrent._0_4_ = 0;
      }
      else {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        puVar5 = (undefined1 *)mmap64(__addr,uVar3 & 0xfffffffffffff000,0,0x32,-1,0);
        if (puVar5 == &DAT_ffffffffffffffff) {
          fprintf(_stderr,"] %s %s:%d","VirtualFree",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
                  ,0x85f);
          fprintf(_stderr,"mmap() returned an abnormal value.\n");
          pthrCurrent._0_4_ = 0;
          CorUnix::CPalThread::SetLastError(0x54f);
        }
        else {
          VIRTUALSetAllocState
                    (0x2000,(long)__addr - p_Var4->startBoundary >> 0xc,uVar3 >> 0xc,p_Var4);
        }
      }
    }
  }
  else {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    pthrCurrent._0_4_ = 0;
  }
  CorUnix::InternalLeaveCriticalSection(pThread,&virtual_critsec);
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return (BOOL)pthrCurrent;
  }
  abort();
}

Assistant:

BOOL
PALAPI
VirtualFree(
        IN LPVOID lpAddress,    /* Address of region. */
        IN SIZE_T dwSize,       /* Size of region. */
        IN DWORD dwFreeType )   /* Operation type. */
{
    BOOL bRetVal = TRUE;
    CPalThread *pthrCurrent;

    PERF_ENTRY(VirtualFree);
    ENTRY("VirtualFree(lpAddress=%p, dwSize=%u, dwFreeType=%#x)\n",
          lpAddress, dwSize, dwFreeType);

    pthrCurrent = InternalGetCurrentThread();
    InternalEnterCriticalSection(pthrCurrent, &virtual_critsec);

    /* Sanity Checks. */
    if ( !lpAddress )
    {
        ERROR( "lpAddress cannot be NULL. You must specify the base address of\
               regions to be de-committed. \n" );
        pthrCurrent->SetLastError( ERROR_INVALID_ADDRESS );
        bRetVal = FALSE;
        goto VirtualFreeExit;
    }

    if ( !( dwFreeType & MEM_RELEASE ) && !(dwFreeType & MEM_DECOMMIT ) )
    {
        ERROR( "dwFreeType must contain one of the following: \
               MEM_RELEASE or MEM_DECOMMIT\n" );
        pthrCurrent->SetLastError( ERROR_INVALID_PARAMETER );
        bRetVal = FALSE;
        goto VirtualFreeExit;
    }
    /* You cannot release and decommit in one call.*/
    if ( dwFreeType & MEM_RELEASE && dwFreeType & MEM_DECOMMIT )
    {
        ERROR( "MEM_RELEASE cannot be combined with MEM_DECOMMIT.\n" );
        bRetVal = FALSE;
        goto VirtualFreeExit;
    }

    if ( dwFreeType & MEM_DECOMMIT )
    {
        UINT_PTR StartBoundary  = 0;
        SIZE_T MemSize        = 0;

        if ( dwSize == 0 )
        {
            ERROR( "dwSize cannot be 0. \n" );
            pthrCurrent->SetLastError( ERROR_INVALID_PARAMETER );
            bRetVal = FALSE;
            goto VirtualFreeExit;
        }
        /*
         * A two byte range straddling 2 pages caues both pages to be either
         * released or decommitted. So round the dwSize up to the next page
         * boundary and round the lpAddress down to the next page boundary.
         */
        MemSize = (((UINT_PTR)(dwSize) + ((UINT_PTR)(lpAddress) & VIRTUAL_PAGE_MASK)
                    + VIRTUAL_PAGE_MASK) & ~VIRTUAL_PAGE_MASK);

        StartBoundary = (UINT_PTR)lpAddress & ~VIRTUAL_PAGE_MASK;

        PCMI pUnCommittedMem;
        pUnCommittedMem = VIRTUALFindRegionInformation( StartBoundary );
        if (!pUnCommittedMem)
        {
            ASSERT( "Unable to locate the region information.\n" );
            pthrCurrent->SetLastError( ERROR_INTERNAL_ERROR );
            bRetVal = FALSE;
            goto VirtualFreeExit;
        }

        TRACE( "Un-committing the following page(s) %d to %d.\n",
               StartBoundary, MemSize );

#if MMAP_DOESNOT_ALLOW_REMAP
        // if no double mapping is supported,
        // just mprotect the memory with no access
        if (mprotect((LPVOID)StartBoundary, MemSize, PROT_NONE) == 0)
#else // MMAP_DOESNOT_ALLOW_REMAP
        // Explicitly calling mmap instead of mprotect here makes it
        // that much more clear to the operating system that we no
        // longer need these pages.
#if RESERVE_FROM_BACKING_FILE
        if ( mmap( (LPVOID)StartBoundary, MemSize, PROT_NONE,
                   MAP_FIXED | MAP_PRIVATE, gBackingFile,
                   (char *) StartBoundary - (char *) gBackingBaseAddress ) !=
             MAP_FAILED )
#else   // RESERVE_FROM_BACKING_FILE
        if ( mmap( (LPVOID)StartBoundary, MemSize, PROT_NONE,
                   MAP_FIXED | MAP_ANON | MAP_PRIVATE, -1, 0 ) != MAP_FAILED )
#endif  // RESERVE_FROM_BACKING_FILE
#endif // MMAP_DOESNOT_ALLOW_REMAP
        {
#if (MMAP_ANON_IGNORES_PROTECTION && !MMAP_DOESNOT_ALLOW_REMAP)
            if (mprotect((LPVOID) StartBoundary, MemSize, PROT_NONE) != 0)
            {
                ASSERT("mprotect failed to protect the region!\n");
                pthrCurrent->SetLastError(ERROR_INTERNAL_ERROR);
                munmap((LPVOID) StartBoundary, MemSize);
                bRetVal = FALSE;
                goto VirtualFreeExit;
            }
#endif  // MMAP_ANON_IGNORES_PROTECTION && !MMAP_DOESNOT_ALLOW_REMAP

            SIZE_T index = 0;
            SIZE_T nNumOfPagesToChange = 0;

            /* We can now commit this memory by calling VirtualAlloc().*/
            index = (StartBoundary - pUnCommittedMem->startBoundary) / VIRTUAL_PAGE_SIZE;

            nNumOfPagesToChange = MemSize / VIRTUAL_PAGE_SIZE;
            VIRTUALSetAllocState( MEM_RESERVE, index,
                                  nNumOfPagesToChange, pUnCommittedMem );
#if MMAP_DOESNOT_ALLOW_REMAP
            VIRTUALSetDirtyPages( 1, index,
                                  nNumOfPagesToChange, pUnCommittedMem );
#endif // MMAP_DOESNOT_ALLOW_REMAP

            goto VirtualFreeExit;
        }
        else
        {
            ASSERT( "mmap() returned an abnormal value.\n" );
            bRetVal = FALSE;
            pthrCurrent->SetLastError( ERROR_INTERNAL_ERROR );
            goto VirtualFreeExit;
        }
    }